

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O2

string * __thiscall pbrt::Timer::ToString_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  time_point local_10;
  
  local_10.__d.__r = (duration)(this->start).__d.__r;
  StringPrintf<long>(__return_storage_ptr__,"[ Timer start(ns): %d ]",(long *)&local_10);
  return __return_storage_ptr__;
}

Assistant:

std::string Timer::ToString() const {
    return StringPrintf(
        "[ Timer start(ns): %d ]",
        std::chrono::duration_cast<std::chrono::nanoseconds>(start.time_since_epoch())
            .count());
}